

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerSettings.cpp
# Opt level: O0

bool __thiscall
PS2KeyboardAnalyzerSettings::SetSettingsFromInterfaces(PS2KeyboardAnalyzerSettings *this)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  Channel *local_d8;
  Channel *local_90;
  Channel local_68 [7];
  bool IsInvalidConfig;
  Channel local_58 [16];
  Channel local_48 [32];
  Channel local_28 [16];
  PS2KeyboardAnalyzerSettings *local_18;
  PS2KeyboardAnalyzerSettings *this_local;
  
  local_18 = this;
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mClockChannel,local_28);
  Channel::~Channel(local_28);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface);
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mDataChannel,local_48);
  Channel::~Channel(local_48);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mDeviceTypeInterface);
  dVar3 = (double)AnalyzerSettingInterfaceNumberList::GetNumber();
  this->mDeviceType = dVar3;
  AnalyzerSettings::ClearChannels();
  local_90 = local_68;
  do {
    Channel::Channel(local_90);
    local_90 = local_90 + 0x10;
  } while (local_90 != local_48);
  Channel::operator=(local_68,&this->mClockChannel);
  Channel::operator=(local_58,&this->mDataChannel);
  bVar1 = AnalyzerHelpers::DoChannelsOverlap(local_68,2);
  bVar2 = (bVar1 & 1) == 0;
  if (bVar2) {
    AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
  }
  else {
    AnalyzerSettings::SetErrorText((char *)this);
  }
  local_d8 = local_48;
  this_local._7_1_ = bVar2;
  do {
    local_d8 = local_d8 + -0x10;
    Channel::~Channel(local_d8);
  } while (local_d8 != local_68);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool PS2KeyboardAnalyzerSettings::SetSettingsFromInterfaces()
{
    mClockChannel = mClockChannelInterface->GetChannel();
    mDataChannel = mDataChannelInterface->GetChannel();
    mDeviceType = mDeviceTypeInterface->GetNumber();
    ClearChannels();

    Channel ArrayOfChannels[ 2 ];
    ArrayOfChannels[ 0 ] = mClockChannel;
    ArrayOfChannels[ 1 ] = mDataChannel;

    bool IsInvalidConfig = AnalyzerHelpers::DoChannelsOverlap( ArrayOfChannels, 2 );

    if( IsInvalidConfig )
    {
        SetErrorText( "Clock and Data must be unique channels!" );
        return false;
    }
    else
    {
        AddChannel( mClockChannel, "PS/2 - Clock", true );
        AddChannel( mDataChannel, "PS/2 - Data", true );
        return true;
    }

    return true;
}